

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O1

Id dxil_spv::build_mask_reduction_input_arith
             (Impl *impl,CallInst *instruction,Id input_value,WaveOpKind op_kind)

{
  bool bVar1;
  Id IVar2;
  TypeID TVar3;
  uint uVar4;
  Builder *this;
  Builder *this_00;
  Operation *op;
  Type *pTVar5;
  Value *pVVar6;
  Operation *this_01;
  unsigned_short u;
  uint16_t f16;
  unsigned_long_long u_00;
  float f;
  double d;
  uint32_t sign_kind;
  char local_34 [4];
  
  this = Converter::Impl::builder(impl);
  this_00 = Converter::Impl::builder(impl);
  IVar2 = spv::Builder::makeBoolType(this_00);
  op = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar2);
  Converter::Impl::add(impl,op,false);
  bVar1 = get_constant_operand(&instruction->super_Instruction,3,(uint32_t *)local_34);
  if (!bVar1) {
    return 0;
  }
  pTVar5 = LLVMBC::Value::getType((Value *)instruction);
  TVar3 = LLVMBC::Type::getTypeID(pTVar5);
  if (TVar3 == FloatTyID) {
    switch(op_kind) {
    case Sum:
      f = 0.0;
      break;
    case Product:
      f = 1.0;
      break;
    case Min:
      f = INFINITY;
      break;
    case Max:
      f = -INFINITY;
      break;
    default:
      goto switchD_0016d314_default;
    }
    uVar4 = spv::Builder::makeFloatConstant(this,f,false);
  }
  else {
    pTVar5 = LLVMBC::Value::getType((Value *)instruction);
    TVar3 = LLVMBC::Type::getTypeID(pTVar5);
    if (TVar3 == DoubleTyID) {
      switch(op_kind) {
      case Sum:
        d = 0.0;
        break;
      case Product:
        d = 1.0;
        break;
      case Min:
        d = INFINITY;
        break;
      case Max:
        d = -INFINITY;
        break;
      default:
        goto switchD_0016d314_default;
      }
      uVar4 = spv::Builder::makeDoubleConstant(this,d,false);
    }
    else {
      pTVar5 = LLVMBC::Value::getType((Value *)instruction);
      TVar3 = LLVMBC::Type::getTypeID(pTVar5);
      if (TVar3 == HalfTyID) {
        switch(op_kind) {
        case Sum:
          f16 = 0;
          break;
        case Product:
          f16 = 0x3c00;
          break;
        case Min:
          f16 = 0x7c00;
          break;
        case Max:
          f16 = 0xfc00;
          break;
        default:
          goto switchD_0016d314_default;
        }
        uVar4 = spv::Builder::makeFloat16Constant(this,f16,false);
      }
      else {
        pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        pTVar5 = LLVMBC::Value::getType(pVVar6);
        uVar4 = LLVMBC::Type::getIntegerBitWidth(pTVar5);
        if (local_34[0] == '\0') {
          if (uVar4 == 0x40) {
            switch(op_kind) {
            case Sum:
              goto switchD_0016d586_caseD_0;
            case Product:
              goto switchD_0016d586_caseD_1;
            case Min:
              u_00 = 0x7fffffffffffffff;
              break;
            case Max:
              u_00 = 0x8000000000000000;
              break;
            default:
              goto switchD_0016d314_default;
            }
            goto LAB_0016d63d;
          }
          if (uVar4 == 0x20) {
            switch(op_kind) {
            case Sum:
              goto switchD_0016d55f_caseD_0;
            case Product:
              goto switchD_0016d55f_caseD_1;
            case Min:
              uVar4 = 0x7fffffff;
              break;
            case Max:
              uVar4 = 0x80000000;
              break;
            default:
              goto switchD_0016d314_default;
            }
            goto LAB_0016d60b;
          }
          if (uVar4 != 0x10) {
            return 0;
          }
          switch(op_kind) {
          case Sum:
            goto switchD_0016d3fd_caseD_0;
          case Product:
            goto switchD_0016d3fd_caseD_1;
          case Min:
            u = 0x7fff;
            break;
          case Max:
            u = 0x8000;
            break;
          default:
            goto switchD_0016d314_default;
          }
LAB_0016d651:
          uVar4 = spv::Builder::makeUint16Constant(this,u,false);
        }
        else if (uVar4 == 0x40) {
          switch(op_kind) {
          case Sum:
          case Max:
switchD_0016d586_caseD_0:
            u_00 = 0;
            break;
          case Product:
switchD_0016d586_caseD_1:
            u_00 = 1;
            break;
          case Min:
            u_00 = 0xffffffffffffffff;
            break;
          default:
            goto switchD_0016d314_default;
          }
LAB_0016d63d:
          uVar4 = spv::Builder::makeUint64Constant(this,u_00,false);
        }
        else {
          if (uVar4 != 0x20) {
            if (uVar4 != 0x10) {
              return 0;
            }
            switch(op_kind) {
            case Sum:
            case Max:
switchD_0016d3fd_caseD_0:
              u = 0;
              break;
            case Product:
switchD_0016d3fd_caseD_1:
              u = 1;
              break;
            case Min:
              u = 0xffff;
              break;
            default:
              goto switchD_0016d314_default;
            }
            goto LAB_0016d651;
          }
          switch(op_kind) {
          case Sum:
          case Max:
switchD_0016d55f_caseD_0:
            uVar4 = 0;
            break;
          case Product:
switchD_0016d55f_caseD_1:
            uVar4 = 1;
            break;
          case Min:
            uVar4 = 0xffffffff;
            break;
          default:
            goto switchD_0016d314_default;
          }
LAB_0016d60b:
          uVar4 = spv::Builder::makeUintConstant(this,uVar4,false);
        }
      }
    }
  }
  this = (Builder *)(ulong)uVar4;
switchD_0016d314_default:
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pTVar5 = LLVMBC::Value::getType(pVVar6);
  IVar2 = Converter::Impl::get_type_id(impl,pTVar5,0);
  this_01 = Converter::Impl::allocate(impl,OpSelect,IVar2);
  Operation::add_id(this_01,op->id);
  Operation::add_id(this_01,(Id)this);
  Operation::add_id(this_01,input_value);
  Converter::Impl::add(impl,this_01,false);
  return this_01->id;
}

Assistant:

static spv::Id build_mask_reduction_input_arith(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                spv::Id input_value, DXIL::WaveOpKind op_kind)
{
	auto &builder = impl.builder();

	// For arithmetic cases, we can just replace the input with a sentinel value
	// if we're a helper lane.
	auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
	impl.add(is_helper_lane);

	uint32_t sign_kind;
	if (!get_constant_operand(instruction, 3, &sign_kind))
		return 0;

#define DECLARE_TYPE_TEMPLATE(type, product, sum, min, max) do { \
	switch (op_kind) \
	{ \
	case DXIL::WaveOpKind::Product: \
		replacement_value = builder.make##type##Constant(product); \
		break; \
	case DXIL::WaveOpKind::Sum: \
		replacement_value = builder.make##type##Constant(sum); \
		break; \
	case DXIL::WaveOpKind::Min: \
		replacement_value = builder.make##type##Constant(min); \
		break; \
	case DXIL::WaveOpKind::Max: \
		replacement_value = builder.make##type##Constant(max); \
		break; \
	} \
} while(0)

	spv::Id replacement_value;
	if (instruction->getType()->getTypeID() == llvm::Type::TypeID::FloatTyID)
	{
		DECLARE_TYPE_TEMPLATE(Float,
		                      1.0f, 0.0f,
		                      std::numeric_limits<float>::infinity(),
		                      -std::numeric_limits<float>::infinity());
	}
	else if (instruction->getType()->getTypeID() == llvm::Type::TypeID::DoubleTyID)
	{
		DECLARE_TYPE_TEMPLATE(Double,
		                      1.0, 0.0,
		                      std::numeric_limits<double>::infinity(),
		                      -std::numeric_limits<double>::infinity());
	}
	else if (instruction->getType()->getTypeID() == llvm::Type::TypeID::HalfTyID)
	{
		DECLARE_TYPE_TEMPLATE(Float16, 0x3c00, 0, 0x7c00, 0xfc00);
	}
	else if (static_cast<DXIL::SignedOpKind>(sign_kind) == DXIL::SignedOpKind::Signed)
	{
		switch (instruction->getOperand(1)->getType()->getIntegerBitWidth())
		{
		case 16:
			DECLARE_TYPE_TEMPLATE(Uint16, 1, 0,
			                      uint16_t(std::numeric_limits<int16_t>::max()),
			                      uint16_t(std::numeric_limits<int16_t>::min()));
			break;

		case 32:
			DECLARE_TYPE_TEMPLATE(Uint, 1, 0,
			                      uint32_t(std::numeric_limits<int32_t>::max()),
			                      uint32_t(std::numeric_limits<int32_t>::min()));
			break;

		case 64:
			DECLARE_TYPE_TEMPLATE(Uint64, 1, 0,
			                      uint64_t(std::numeric_limits<int64_t>::max()),
			                      uint64_t(std::numeric_limits<int64_t>::min()));
			break;

		default:
			return 0;
		}
	}
	else
	{
		switch (instruction->getOperand(1)->getType()->getIntegerBitWidth())
		{
		case 16:
			DECLARE_TYPE_TEMPLATE(Uint16, 1, 0,
			                      std::numeric_limits<uint16_t>::max(),
			                      std::numeric_limits<uint16_t>::min());
			break;

		case 32:
			DECLARE_TYPE_TEMPLATE(Uint, 1, 0,
			                      std::numeric_limits<uint32_t>::max(),
			                      std::numeric_limits<uint32_t>::min());
			break;

		case 64:
			DECLARE_TYPE_TEMPLATE(Uint64, 1, 0,
			                      std::numeric_limits<uint64_t>::max(),
			                      std::numeric_limits<uint64_t>::min());
			break;

		default:
			return 0;
		}
	}

	auto *replace_op = impl.allocate(spv::OpSelect, impl.get_type_id(instruction->getOperand(1)->getType()));
	replace_op->add_id(is_helper_lane->id);
	replace_op->add_id(replacement_value);
	replace_op->add_id(input_value);
	impl.add(replace_op);
	return replace_op->id;
}